

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rtreedepth(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  int iVar1;
  ushort *puVar2;
  
  if (((*apArg)->flags & 0xf) == 0) {
    iVar1 = sqlite3_value_bytes(*apArg);
    if (1 < iVar1) {
      puVar2 = (ushort *)sqlite3_value_blob(*apArg);
      sqlite3_result_int(ctx,(uint)(ushort)(*puVar2 << 8 | *puVar2 >> 8));
      return;
    }
  }
  sqlite3_result_error(ctx,"Invalid argument to rtreedepth()",-1);
  return;
}

Assistant:

static void rtreedepth(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  UNUSED_PARAMETER(nArg);
  if( sqlite3_value_type(apArg[0])!=SQLITE_BLOB 
   || sqlite3_value_bytes(apArg[0])<2
  ){
    sqlite3_result_error(ctx, "Invalid argument to rtreedepth()", -1); 
  }else{
    u8 *zBlob = (u8 *)sqlite3_value_blob(apArg[0]);
    sqlite3_result_int(ctx, readInt16(zBlob));
  }
}